

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.h
# Opt level: O1

string * __thiscall
cmdline::parser::
option_with_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::full_description(string *__return_storage_ptr__,
                  option_with_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *this,string *desc)

{
  bool bVar1;
  pointer pcVar2;
  long lVar3;
  undefined8 *puVar4;
  long *plVar5;
  long *plVar6;
  ulong *puVar7;
  size_type *psVar8;
  ulong uVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  ulong *local_128;
  long local_120;
  ulong local_118;
  long lStack_110;
  ulong *local_108;
  long local_100;
  ulong local_f8;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  long *local_e8;
  undefined8 local_e0;
  long local_d8;
  undefined8 uStack_d0;
  ulong *local_c8;
  long local_c0;
  ulong local_b8 [2];
  long *local_a8;
  long local_a0;
  long local_98 [2];
  long *local_88;
  long local_80;
  long local_78;
  long lStack_70;
  long *local_68 [2];
  long local_58 [2];
  undefined4 *local_48;
  undefined8 local_40;
  undefined4 local_38;
  undefined2 uStack_34;
  undefined1 uStack_32;
  undefined1 uStack_31;
  
  pcVar2 = (desc->_M_dataplus)._M_p;
  local_c8 = local_b8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c8,pcVar2,pcVar2 + desc->_M_string_length);
  std::__cxx11::string::append((char *)&local_c8);
  local_38 = 0x69727473;
  uStack_34 = 0x676e;
  local_40 = 6;
  uStack_32 = 0;
  uVar9 = 0xf;
  if (local_c8 != local_b8) {
    uVar9 = local_b8[0];
  }
  local_48 = &local_38;
  if ((local_c0 + 6U < 0x10) && (uVar9 < local_c0 + 6U)) {
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_48,0,(char *)0x0,(ulong)local_c8);
  }
  else {
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_c8,(ulong)&local_38);
  }
  local_108 = &local_f8;
  puVar7 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar7) {
    local_f8 = *puVar7;
    uStack_f0 = *(undefined4 *)(puVar4 + 3);
    uStack_ec = *(undefined4 *)((long)puVar4 + 0x1c);
  }
  else {
    local_f8 = *puVar7;
    local_108 = (ulong *)*puVar4;
  }
  local_100 = puVar4[1];
  *puVar4 = puVar7;
  puVar4[1] = 0;
  *(undefined1 *)puVar7 = 0;
  bVar1 = this->need;
  if (bVar1 == true) {
    local_128 = &local_118;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"");
  }
  else {
    local_a8 = local_98;
    pcVar2 = (this->def)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a8,pcVar2,pcVar2 + (this->def)._M_string_length);
    local_68[0] = local_58;
    std::__cxx11::string::_M_construct<char*>((string *)local_68,local_a8,local_a0 + (long)local_a8)
    ;
    plVar5 = (long *)std::__cxx11::string::replace((ulong)local_68,0,(char *)0x0,0x1122d1);
    local_88 = &local_78;
    plVar6 = plVar5 + 2;
    if ((long *)*plVar5 == plVar6) {
      local_78 = *plVar6;
      lStack_70 = plVar5[3];
    }
    else {
      local_78 = *plVar6;
      local_88 = (long *)*plVar5;
    }
    local_80 = plVar5[1];
    *plVar5 = (long)plVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_88);
    local_128 = &local_118;
    puVar7 = (ulong *)(plVar5 + 2);
    if ((ulong *)*plVar5 == puVar7) {
      local_118 = *puVar7;
      lStack_110 = plVar5[3];
    }
    else {
      local_118 = *puVar7;
      local_128 = (ulong *)*plVar5;
    }
    local_120 = plVar5[1];
    *plVar5 = (long)puVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
  }
  uVar9 = 0xf;
  if (local_108 != &local_f8) {
    uVar9 = local_f8;
  }
  if (uVar9 < (ulong)(local_120 + local_100)) {
    uVar9 = 0xf;
    if (local_128 != &local_118) {
      uVar9 = local_118;
    }
    if ((ulong)(local_120 + local_100) <= uVar9) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_128,0,(char *)0x0,(ulong)local_108);
      goto LAB_0010d4ce;
    }
  }
  puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_108,(ulong)local_128);
LAB_0010d4ce:
  local_e8 = &local_d8;
  plVar5 = puVar4 + 2;
  if ((long *)*puVar4 == plVar5) {
    local_d8 = *plVar5;
    uStack_d0 = puVar4[3];
  }
  else {
    local_d8 = *plVar5;
    local_e8 = (long *)*puVar4;
  }
  local_e0 = puVar4[1];
  *puVar4 = plVar5;
  puVar4[1] = 0;
  *(undefined1 *)plVar5 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_e8);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar8 = (size_type *)(plVar5 + 2);
  if ((size_type *)*plVar5 == psVar8) {
    lVar3 = plVar5[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
  }
  __return_storage_ptr__->_M_string_length = plVar5[1];
  *plVar5 = (long)psVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if (local_e8 != &local_d8) {
    operator_delete(local_e8,local_d8 + 1);
  }
  if (local_128 != &local_118) {
    operator_delete(local_128,local_118 + 1);
  }
  if (bVar1 == false) {
    if (local_88 != &local_78) {
      operator_delete(local_88,local_78 + 1);
    }
    if (local_68[0] != local_58) {
      operator_delete(local_68[0],local_58[0] + 1);
    }
    if (local_a8 != local_98) {
      operator_delete(local_a8,local_98[0] + 1);
    }
  }
  if (local_108 != &local_f8) {
    operator_delete(local_108,local_f8 + 1);
  }
  if (local_48 != &local_38) {
    operator_delete(local_48,CONCAT17(uStack_31,CONCAT16(uStack_32,CONCAT24(uStack_34,local_38))) +
                             1);
  }
  if (local_c8 != local_b8) {
    operator_delete(local_c8,local_b8[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string full_description(const std::string &desc){
      return
        desc+" ("+detail::readable_typename<T>()+
        (need?"":" [="+detail::default_value<T>(def)+"]")
        +")";
    }